

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tfidfinit.cpp
# Opt level: O2

void readfile(char *data_file)

{
  char *pcVar1;
  _Rb_tree_node_base *p_Var2;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var3;
  int i;
  int iVar4;
  long lVar5;
  int j;
  int i_1;
  long lVar6;
  double dVar7;
  double dVar8;
  double now_data;
  vector<int,_std::allocator<int>_> all_label;
  set<int,_std::less<int>,_std::allocator<int>_> pool;
  char buff [200000];
  double dStack_30dd8;
  FILE *pFStack_30dd0;
  _Vector_base<int,_std::allocator<int>_> _Stack_30dc8;
  undefined1 auStack_30da8 [8];
  pointer pdStack_30da0;
  _Base_ptr p_Stack_30d98;
  _Rb_tree_node_base *p_Stack_30d90;
  _Rb_tree_node_base *p_Stack_30d88;
  size_t sStack_30d80;
  char acStack_30d78 [200008];
  
  pFStack_30dd0 = fopen(data_file,"r");
  for (iVar4 = 0; iVar4 < data_n; iVar4 = iVar4 + 1) {
    auStack_30da8 = (undefined1  [8])0x0;
    pdStack_30da0 = (pointer)0x0;
    p_Stack_30d98 = (_Base_ptr)0x0;
    std::
    vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
    ::emplace_back<std::vector<double,std::allocator<double>>>
              ((vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
                *)&data_x,(vector<double,_std::allocator<double>_> *)auStack_30da8);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)auStack_30da8);
  }
  p_Stack_30d90 = (_Rb_tree_node_base *)&pdStack_30da0;
  pdStack_30da0 = (pointer)((ulong)pdStack_30da0 & 0xffffffff00000000);
  p_Stack_30d98 = (_Base_ptr)0x0;
  sStack_30d80 = 0;
  _Stack_30dc8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _Stack_30dc8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  _Stack_30dc8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Stack_30d88 = p_Stack_30d90;
  for (lVar5 = 0; lVar5 < data_n; lVar5 = lVar5 + 1) {
    fgets(acStack_30d78,200000,pFStack_30dd0);
    pcVar1 = strtok(acStack_30d78,", \r\n");
    iVar4 = atoi(pcVar1);
    dStack_30dd8._0_4_ = iVar4;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(&label,(int *)&dStack_30dd8);
    dStack_30dd8 = (double)CONCAT44(dStack_30dd8._4_4_,iVar4);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
    _M_insert_unique<int>
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               auStack_30da8,(int *)&dStack_30dd8);
    pcVar1 = strtok((char *)0x0,", \r\n");
    for (iVar4 = 0; iVar4 < ts_len; iVar4 = iVar4 + 1) {
      dStack_30dd8 = atof(pcVar1);
      dVar8 = dStack_30dd8;
      if (dStack_30dd8 <= max_data) {
        dVar8 = max_data;
      }
      dVar7 = dStack_30dd8;
      if (min_data <= dStack_30dd8) {
        dVar7 = min_data;
      }
      max_data = dVar8;
      min_data = dVar7;
      std::vector<double,_std::allocator<double>_>::push_back
                (data_x.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + lVar5,&dStack_30dd8);
      pcVar1 = strtok((char *)0x0,", \r\n");
    }
  }
  num_c = (int)sStack_30d80;
  for (p_Var2 = p_Stack_30d90; p_Var2 != (_Rb_tree_node_base *)&pdStack_30da0;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&_Stack_30dc8,
               (value_type_conflict1 *)(p_Var2 + 1));
  }
  lVar5 = 0;
  for (lVar6 = 0; lVar6 < data_n; lVar6 = lVar6 + 1) {
    _Var3 = std::
            __lower_bound<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int,__gnu_cxx::__ops::_Iter_less_val>
                      (_Stack_30dc8._M_impl.super__Vector_impl_data._M_start,
                       _Stack_30dc8._M_impl.super__Vector_impl_data._M_finish,
                       (long)label.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar5);
    iVar4 = (int)((ulong)((long)_Var3._M_current -
                         (long)_Stack_30dc8._M_impl.super__Vector_impl_data._M_start) >> 2);
    *(int *)((long)label.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar5) = iVar4;
    datacnt[iVar4] = datacnt[iVar4] + 1;
    lVar5 = lVar5 + 4;
  }
  max_data = ((max_data - min_data) / 10.0) / 100.0 + max_data;
  bucket_w = (max_data - min_data) / 10.0;
  fclose(pFStack_30dd0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&_Stack_30dc8);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             auStack_30da8);
  return;
}

Assistant:

void readfile(char *data_file) {
    FILE *f;
    f = fopen(data_file, "r");

    char buff[MAX_CHAR_PER_LINE];
    char *tmp;

    for (int i = 0; i < data_n; ++i) {
        data_x.push_back(vector<double>());
    }

    set<int> pool;
    vector<int> all_label;

    for (int i = 0; i < data_n; i++) {
        fgets(buff, MAX_CHAR_PER_LINE, f);
        tmp = strtok(buff, ", \r\n");

        double now_label = atoi(tmp);
        label.push_back(now_label);
        pool.insert(now_label);

        tmp = strtok(NULL, ", \r\n");
        for (int j = 0; j < ts_len; ++j) {

            double now_data = atof(tmp);
            max_data = max(max_data, now_data);
            min_data = min(min_data, now_data);

            data_x[i].push_back(now_data);
            tmp = strtok(NULL, ", \r\n");
        }
    }

    num_c = pool.size();
//    for (int item : pool) {
//        all_label.push_back(item);
//    }
    for (set<int>::iterator it = pool.begin(); it != pool.end(); ++it) {
        all_label.push_back(*it);
    }

    for (int i = 0; i < data_n; ++i) {
        label[i] = lower_bound(all_label.begin(), all_label.end(), label[i]) - all_label.begin();
        ++datacnt[label[i]];
    }

    bucket_w = (max_data - min_data) / PAA_BUCKET;
    max_data += bucket_w / 100;
    bucket_w = (max_data - min_data) / PAA_BUCKET;

    fclose(f);
}